

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::AppendToTestWarningsOutputFile(string *str)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  GTestLog *in_stack_00000030;
  FILE *file;
  char *filename;
  char *in_stack_ffffffffffffffa8;
  GTestLog *in_stack_ffffffffffffffb0;
  GTestLog *this;
  GTestLog local_30 [5];
  GTestLog local_1c;
  FILE *local_18;
  char *local_10;
  
  local_10 = posix::GetEnv((char *)0x1a9a25);
  if ((local_10 != (char *)0x0) &&
     (local_18 = (FILE *)posix::FOpen((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8),
     local_18 != (FILE *)0x0)) {
    __ptr = (void *)std::__cxx11::string::data();
    sVar3 = std::__cxx11::string::size();
    sVar3 = fwrite(__ptr,1,sVar3,local_18);
    sVar4 = std::__cxx11::string::size();
    bVar1 = IsTrue(sVar3 == sVar4);
    if (!bVar1) {
      GTestLog::GTestLog(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
      poVar5 = GTestLog::GetStream(&local_1c);
      std::operator<<(poVar5,
                      "Condition fwrite(str.data(), 1, str.size(), file) == str.size() failed. ");
      GTestLog::~GTestLog(in_stack_ffffffffffffffb0);
    }
    iVar2 = posix::FClose((FILE *)0x1a9b28);
    bVar1 = IsTrue(iVar2 == 0);
    if (!bVar1) {
      this = local_30;
      GTestLog::GTestLog(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
      poVar5 = GTestLog::GetStream(this);
      std::operator<<(poVar5,"Condition posix::FClose(file) == 0 failed. ");
      GTestLog::~GTestLog(this);
    }
  }
  return;
}

Assistant:

static void AppendToTestWarningsOutputFile(const std::string& str) {
  const char* const filename = posix::GetEnv(kTestWarningsOutputFile);
  if (filename == nullptr) {
    return;
  }
  auto* const file = posix::FOpen(filename, "a");
  if (file == nullptr) {
    return;
  }
  GTEST_CHECK_(fwrite(str.data(), 1, str.size(), file) == str.size());
  GTEST_CHECK_(posix::FClose(file) == 0);
}